

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O2

axbStatus_t axbMemBackendRegister(axbHandle_s *handle,axbMemBackend_s *mem)

{
  axbMemBackend_s **__ptr;
  size_t i;
  axbMemBackend_s **ppaVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = handle->memBackends_size;
  if (sVar3 == handle->memBackends_capacity) {
    __ptr = handle->memBackends;
    handle->memBackends_capacity = sVar3 * 2;
    ppaVar1 = (axbMemBackend_s **)malloc(sVar3 << 4);
    handle->memBackends = ppaVar1;
    for (sVar2 = 0; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      handle->memBackends[sVar2] = __ptr[sVar2];
    }
    free(__ptr);
    sVar3 = handle->memBackends_size;
  }
  handle->memBackends[sVar3] = mem;
  handle->memBackends_size = sVar3 + 1;
  return 0;
}

Assistant:

axbStatus_t axbMemBackendRegister(struct axbHandle_s *handle, struct axbMemBackend_s *mem)
{
  // check if there is still room for another backend. If not, resize array:
  if (handle->memBackends_size == handle->memBackends_capacity) {
    struct axbMemBackend_s **old_array = handle->memBackends;
    handle->memBackends_capacity *= 2;
    handle->memBackends = malloc(handle->memBackends_capacity * sizeof(struct axbMemBackend_s *));

    // copy over existing backends:
    for (size_t i=0; i<handle->memBackends_size; ++i) handle->memBackends[i] = old_array[i];
    free(old_array);
  }

  handle->memBackends[handle->memBackends_size] = mem;
  handle->memBackends_size += 1;
  return 0;
}